

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_symbols.hpp
# Opt level: O0

bool __thiscall
ELFIO::symbol_section_accessor_template<const_ELFIO::section>::get_symbol
          (symbol_section_accessor_template<const_ELFIO::section> *this,Elf_Xword index,string *name
          ,Elf64_Addr *value,Elf_Xword *size,uchar *bind,uchar *type,Elf_Half *section_index,
          uchar *other)

{
  uchar uVar1;
  bool local_39;
  bool ret;
  uchar *bind_local;
  Elf_Xword *size_local;
  Elf64_Addr *value_local;
  string *name_local;
  Elf_Xword index_local;
  symbol_section_accessor_template<const_ELFIO::section> *this_local;
  
  uVar1 = elfio::get_class(this->elf_file);
  if (uVar1 == '\x01') {
    local_39 = generic_get_symbol<ELFIO::Elf32_Sym>
                         (this,index,name,value,size,bind,type,section_index,other);
  }
  else {
    local_39 = generic_get_symbol<ELFIO::Elf64_Sym>
                         (this,index,name,value,size,bind,type,section_index,other);
  }
  return local_39;
}

Assistant:

bool get_symbol( Elf_Xword      index,
                     std::string&   name,
                     Elf64_Addr&    value,
                     Elf_Xword&     size,
                     unsigned char& bind,
                     unsigned char& type,
                     Elf_Half&      section_index,
                     unsigned char& other ) const
    {
        bool ret = false;

        if ( elf_file.get_class() == ELFCLASS32 ) {
            ret = generic_get_symbol<Elf32_Sym>( index, name, value, size, bind,
                                                 type, section_index, other );
        }
        else {
            ret = generic_get_symbol<Elf64_Sym>( index, name, value, size, bind,
                                                 type, section_index, other );
        }

        return ret;
    }